

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O3

void __thiscall serialization::xml_oarchive::save_sequence_start(xml_oarchive *this,size_type size)

{
  memory_pool<char> *this_00;
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  xml_node<char> *this_01;
  char *value;
  xml_attribute<char> *attribute;
  string __str;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  this_00 = &(this->document_).super_memory_pool<char>;
  this_01 = (xml_node<char> *)rapidxml::memory_pool<char>::allocate_aligned(this_00,0x60);
  (this_01->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (this_01->super_xml_base<char>).m_value = (char *)0x0;
  this_01->m_type = node_element;
  this_01->m_first_node = (xml_node<char> *)0x0;
  this_01->m_first_attribute = (xml_attribute<char> *)0x0;
  (this_01->super_xml_base<char>).m_name = "sequence";
  (this_01->super_xml_base<char>).m_name_size = 8;
  cVar4 = '\x01';
  if (9 < size) {
    uVar2 = size;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00114395;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00114395;
      }
      if (uVar2 < 10000) goto LAB_00114395;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00114395:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,size);
  value = rapidxml::memory_pool<char>::allocate_string(this_00,(char *)local_50,0);
  attribute = rapidxml::memory_pool<char>::allocate_attribute(this_00,"size",value,0,0);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  rapidxml::xml_node<char>::append_attribute(this_01,attribute);
  rapidxml::xml_node<char>::append_node(this->current_,this_01);
  this->current_ = this_01;
  return;
}

Assistant:

void save_sequence_start(size_type size)
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "sequence");
        auto attr = document_.allocate_attribute("size", document_.allocate_string(std::to_string(size).c_str()));
        node->append_attribute(attr);
        current_->append_node(node);
        current_ = node;
    }